

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QSize __thiscall QMainWindowLayout::minimumSize(QMainWindowLayout *this)

{
  QSize QVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  
  if ((*(int *)(this + 0x784) < 0) || (*(int *)(this + 0x788) < 0)) {
    QVar1 = QMainWindowLayoutState::minimumSize((QMainWindowLayoutState *)(this + 0x88));
    *(QSize *)(this + 0x784) = QVar1;
    if (*(long **)(this + 0x708) == (long *)0x0) {
      uVar2 = 0;
      iVar3 = 0;
    }
    else {
      uVar2 = (**(code **)(**(long **)(this + 0x708) + 0x18))();
      iVar3 = (int)(uVar2 >> 0x20);
    }
    uVar4 = (ulong)*(uint *)(this + 0x784);
    if ((int)*(uint *)(this + 0x784) < (int)uVar2) {
      uVar4 = uVar2 & 0xffffffff;
    }
    *(ulong *)(this + 0x784) = uVar4 | (ulong)(uint)(iVar3 + *(int *)(this + 0x788)) << 0x20;
  }
  return *(QSize *)(this + 0x784);
}

Assistant:

QSize QMainWindowLayout::minimumSize() const
{
    if (!minSize.isValid()) {
        minSize = layoutState.minimumSize();
        const QSize sbMin = statusbar ? statusbar->minimumSize() : QSize(0, 0);
        minSize = QSize(qMax(sbMin.width(), minSize.width()),
                        sbMin.height() + minSize.height());
    }
    return minSize;
}